

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::
SmallVector<wasm::Walker<wasm::BranchUtils::BranchAccumulator,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,void>>::Task,10ul>
::
emplace_back<void(*&)(wasm::BranchUtils::BranchAccumulator*,wasm::Expression**),wasm::Expression**&>
          (SmallVector<wasm::Walker<wasm::BranchUtils::BranchAccumulator,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,void>>::Task,10ul>
           *this,_func_void_BranchAccumulator_ptr_Expression_ptr_ptr **Args,Expression ***Args_1)

{
  ulong uVar1;
  Expression **ppEVar2;
  
  uVar1 = *(ulong *)this;
  if (uVar1 < 10) {
    *(ulong *)this = uVar1 + 1;
    ppEVar2 = *Args_1;
    *(_func_void_BranchAccumulator_ptr_Expression_ptr_ptr **)(this + uVar1 * 0x10 + 8) = *Args;
    *(Expression ***)(this + uVar1 * 0x10 + 0x10) = ppEVar2;
    return;
  }
  std::
  vector<wasm::Walker<wasm::BranchUtils::BranchAccumulator,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,void>>::Task,std::allocator<wasm::Walker<wasm::BranchUtils::BranchAccumulator,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,void>>::Task>>
  ::
  emplace_back<void(*&)(wasm::BranchUtils::BranchAccumulator*,wasm::Expression**),wasm::Expression**&>
            ((vector<wasm::Walker<wasm::BranchUtils::BranchAccumulator,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,void>>::Task,std::allocator<wasm::Walker<wasm::BranchUtils::BranchAccumulator,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,void>>::Task>>
              *)(this + 0xa8),Args,Args_1);
  return;
}

Assistant:

void emplace_back(ArgTypes&&... Args) {
    if (usedFixed < N) {
      new (&fixed[usedFixed++]) T(std::forward<ArgTypes>(Args)...);
    } else {
      flexible.emplace_back(std::forward<ArgTypes>(Args)...);
    }
  }